

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphericalHarmonic.cpp
# Opt level: O2

ComplexType __thiscall
OpenMD::SphericalHarmonic::getValueAt(SphericalHarmonic *this,RealType costheta,RealType phi)

{
  RealType RVar1;
  RealType RVar2;
  complex<double> cVar3;
  ComplexType phase;
  RealType local_38 [2];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  RVar2 = phi;
  RVar1 = Ptilde(this,this->L,this->M,costheta);
  local_18._8_8_ = (double)this->M * phi;
  local_18._0_8_ = 0;
  std::exp<double>((complex<double> *)local_18);
  local_38[1] = 0.0;
  local_38[0] = RVar1;
  local_28._8_8_ = RVar2;
  cVar3 = std::operator*((complex<double> *)local_28,(complex<double> *)local_38);
  return (ComplexType)cVar3._M_value;
}

Assistant:

ComplexType SphericalHarmonic::getValueAt(RealType costheta, RealType phi) {
  RealType p;

  // associated Legendre polynomial
  p = Ptilde(L, M, costheta);
  ComplexType phase(0.0, (RealType)M * phi);

  return exp(phase) * (ComplexType)p;
}